

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O2

void __thiscall TPZSFMatrix<long_double>::TPZSFMatrix(TPZSFMatrix<long_double> *this,int64_t dim)

{
  ulong uVar1;
  longdouble *plVar2;
  
  TPZMatrix<long_double>::TPZMatrix(&this->super_TPZMatrix<long_double>,&PTR_PTR_0169e650,dim,dim);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSFMatrix_0169e3d0;
  uVar1 = Size(this);
  plVar2 = (longdouble *)operator_new__(-(ulong)(uVar1 >> 0x3c != 0) | uVar1 << 4);
  this->fElem = plVar2;
  (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (this);
  return;
}

Assistant:

TPZSFMatrix<TVar> ::TPZSFMatrix(const int64_t dim )
: TPZRegisterClassId(&TPZSFMatrix::ClassId),
TPZMatrix<TVar>( dim, dim )
{
    int64_t size = Size();
	fElem = new TVar[ size ] ;
	
	if ( fElem == NULL )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Constructor <memory allocation error>." );
	
	// Zera a Matriz.
	Zero();
}